

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O2

void __thiscall
HdmiCecAnalyzerResults::GenerateTransactionTabularText
          (HdmiCecAnalyzerResults *this,U64 param_1,DisplayBase param_2)

{
  allocator local_31;
  string local_30;
  
  AnalyzerResults::ClearResultStrings();
  std::__cxx11::string::string((string *)&local_30,"Not supported",&local_31);
  AddResult(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenerateTransactionTabularText( U64 /*transaction_id*/, DisplayBase /*display_base*/ )
{
    ClearResultStrings();
    AddResult( "Not supported" );
}